

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestDyndepLoadMissingFile::Run(GraphTestDyndepLoadMissingFile *this)

{
  Test *pTVar1;
  bool bVar2;
  bool bVar3;
  Node *pNVar4;
  allocator<char> local_91;
  string local_90;
  uint local_70;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string err;
  GraphTestDyndepLoadMissingFile *this_local;
  
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 8));
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule r\n  command = unused\nbuild out: r in || dd\n  dyndep = dd\n",
              (ManifestParserOptions)err.field_2._8_8_);
  std::__cxx11::string::string((string *)local_38);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"dd",&local_59);
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_58);
  bVar2 = Node::dyndep_pending(pNVar4);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x20b,"GetNode(\"dd\")->dyndep_pending()");
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pTVar1 = g_current_test;
  bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
  if (bVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"dd",&local_91);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_90);
    bVar3 = DependencyScan::LoadDyndeps(&(this->super_GraphTest).scan_,pNVar4,(string *)local_38);
    testing::Test::Check
              (pTVar1,(bool)(~bVar3 & 1),
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x20c,"scan_.LoadDyndeps(GetNode(\"dd\"), &err)");
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    pTVar1 = g_current_test;
    bVar3 = std::operator==("loading \'dd\': No such file or directory",
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x20d,"\"loading \'dd\': No such file or directory\" == err");
  }
  local_70 = (uint)bVar2;
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TEST_F(GraphTest, DyndepLoadMissingFile) {
  AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"build out: r in || dd\n"
"  dyndep = dd\n"
  );

  string err;
  ASSERT_TRUE(GetNode("dd")->dyndep_pending());
  EXPECT_FALSE(scan_.LoadDyndeps(GetNode("dd"), &err));
  EXPECT_EQ("loading 'dd': No such file or directory", err);
}